

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_scwp(DisasContext_conflict6 *ctx,uint32_t base,int16_t offset,uint32_t reg1,uint32_t reg2,
             _Bool eva)

{
  TCGContext_conflict6 *s;
  TCGTemp *pTVar1;
  TCGTemp *pTVar2;
  TCGTemp *a1;
  TCGTemp *pTVar3;
  TCGTemp *a1_00;
  TCGTemp *a1_01;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGv_i64 pTVar4;
  int iVar5;
  undefined6 in_register_00000012;
  TCGOpcode TVar6;
  TCGArg idx;
  TCGv_i64 addr;
  TCGv_i64 cmpv;
  ulong uVar7;
  char local_74;
  
  iVar5 = (int)CONCAT62(in_register_00000012,offset);
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,true);
  addr = (TCGv_i64)((long)pTVar1 - (long)s);
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,true);
  pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  a1_01 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  l = gen_new_label_mips64el(s);
  l_00 = gen_new_label_mips64el(s);
  gen_base_offset_addr(ctx,addr,base,0);
  tcg_gen_op3_mips64el(s,INDEX_op_ld_i64,(TCGArg)pTVar1,(TCGArg)(s->cpu_env + (long)s),0x780);
  tcg_gen_brcond_i64_mips64el(s,TCG_COND_NE,addr,(TCGv_i64)((long)pTVar1 - (long)s),l);
  if (iVar5 == 0) {
    TVar6 = INDEX_op_movi_i64;
    pTVar4 = (TCGv_i64)0x0;
LAB_009892a4:
    tcg_gen_op2_mips64el(s,TVar6,(TCGArg)a1_00,(TCGArg)pTVar4);
  }
  else if (s->cpu_gpr[iVar5] != (TCGv_i64)((long)a1_00 - (long)s)) {
    pTVar4 = s->cpu_gpr[iVar5] + (long)s;
    TVar6 = INDEX_op_mov_i64;
    goto LAB_009892a4;
  }
  if (reg1 == 0) {
    TVar6 = INDEX_op_movi_i64;
    pTVar4 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[(int)reg1] == (TCGv_i64)((long)a1_01 - (long)s)) goto LAB_009892ef;
    pTVar4 = s->cpu_gpr[(int)reg1] + (long)s;
    TVar6 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_mips64el(s,TVar6,(TCGArg)a1_01,(TCGArg)pTVar4);
LAB_009892ef:
  cmpv = (TCGv_i64)((long)a1 - (long)s);
  pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
  tcg_gen_deposit_i64_mips64el
            (s,(TCGv_i64)((long)pTVar2 - (long)s),(TCGv_i64)((long)a1_00 - (long)s),
             (TCGv_i64)((long)a1_01 - (long)s),0x20,0x20);
  tcg_gen_op3_mips64el(s,INDEX_op_ld_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),0x790);
  idx = 2;
  local_74 = (char)reg2;
  if (local_74 == '\0') {
    idx = (TCGArg)ctx->mem_idx;
  }
  tcg_gen_atomic_cmpxchg_i64_mips64el
            (s,pTVar4,addr,cmpv,(TCGv_i64)((long)pTVar2 - (long)s),idx,MO_64);
  if (iVar5 == 0) {
    tcg_gen_brcond_i64_mips64el(s,TCG_COND_EQ,pTVar4,cmpv,l_00);
    *(byte *)l = *(byte *)l | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)l);
  }
  else {
    uVar7 = CONCAT62(in_register_00000012,offset) & 0xffffffff;
    tcg_gen_op2_mips64el
              (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[uVar7]),1);
    tcg_gen_brcond_i64_mips64el(s,TCG_COND_EQ,pTVar4,cmpv,l_00);
    *(byte *)l = *(byte *)l | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)l);
    tcg_gen_op2_mips64el
              (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[uVar7]),0);
  }
  *(byte *)l_00 = *(byte *)l_00 | 1;
  tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)l_00);
  tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar1,0xffffffffffffffff);
  tcg_gen_op3_mips64el(s,INDEX_op_st_i64,(TCGArg)pTVar1,(TCGArg)(s->cpu_env + (long)s),0x780);
  return;
}

Assistant:

static void gen_scwp(DisasContext *ctx, uint32_t base, int16_t offset,
                    uint32_t reg1, uint32_t reg2, bool eva)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv taddr = tcg_temp_local_new(tcg_ctx);
    TCGv lladdr = tcg_temp_local_new(tcg_ctx);
    TCGv_i64 tval = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 llval = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);
    TCGv tmp1 = tcg_temp_new(tcg_ctx);
    TCGv tmp2 = tcg_temp_new(tcg_ctx);
    TCGLabel *lab_fail = gen_new_label(tcg_ctx);
    TCGLabel *lab_done = gen_new_label(tcg_ctx);

    gen_base_offset_addr(ctx, taddr, base, offset);

    tcg_gen_ld_tl(tcg_ctx, lladdr, tcg_ctx->cpu_env, offsetof(CPUMIPSState, lladdr));
    tcg_gen_brcond_tl(tcg_ctx, TCG_COND_NE, taddr, lladdr, lab_fail);

    gen_load_gpr(tcg_ctx, tmp1, reg1);
    gen_load_gpr(tcg_ctx, tmp2, reg2);

#ifdef TARGET_WORDS_BIGENDIAN
    tcg_gen_concat_tl_i64(tcg_ctx, tval, tmp2, tmp1);
#else
    tcg_gen_concat_tl_i64(tcg_ctx, tval, tmp1, tmp2);
#endif

    tcg_gen_ld_i64(tcg_ctx, llval, tcg_ctx->cpu_env, offsetof(CPUMIPSState, llval_wp));
    tcg_gen_atomic_cmpxchg_i64(tcg_ctx, val, taddr, llval, tval,
                               eva ? MIPS_HFLAG_UM : ctx->mem_idx, MO_64);
    if (reg1 != 0) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg1], 1);
    }
    tcg_gen_brcond_i64(tcg_ctx, TCG_COND_EQ, val, llval, lab_done);

    gen_set_label(tcg_ctx, lab_fail);

    if (reg1 != 0) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg1], 0);
    }
    gen_set_label(tcg_ctx, lab_done);
    tcg_gen_movi_tl(tcg_ctx, lladdr, -1);
    tcg_gen_st_tl(tcg_ctx, lladdr, tcg_ctx->cpu_env, offsetof(CPUMIPSState, lladdr));
}